

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

uint32_t * light_pcapng_to_memory(light_pcapng pcapng,size_t *size)

{
  size_t __n;
  light_pcapng iterator;
  _light_pcapng *p_Var1;
  uint32_t *puVar2;
  uint32_t *__src;
  uint32_t *puVar3;
  uint uVar4;
  long lVar5;
  ulong __n_00;
  size_t size_1;
  size_t __nmemb;
  size_t option_length;
  size_t local_38;
  
  if (pcapng == (light_pcapng)0x0) {
    *size = 0;
  }
  else {
    __nmemb = 0;
    p_Var1 = pcapng;
    do {
      __nmemb = __nmemb + p_Var1->block_total_lenght;
      p_Var1 = p_Var1->next_block;
    } while (p_Var1 != (_light_pcapng *)0x0);
    puVar2 = (uint32_t *)calloc(__nmemb,1);
    if (puVar2 != (uint32_t *)0x0) {
      *size = 0;
      puVar3 = puVar2;
      while( true ) {
        if (__nmemb == 0) {
          return puVar2;
        }
        lVar5 = (ulong)pcapng->block_total_lenght - 0xc;
        __src = __get_option_size(pcapng->options,&local_38);
        __n = local_38;
        __n_00 = lVar5 - local_38;
        *puVar3 = pcapng->block_type;
        puVar3[1] = pcapng->block_total_lenght;
        memcpy(puVar3 + 2,pcapng->block_body,__n_00);
        memcpy((void *)((long)puVar3 + (__n_00 & 0xfffffffffffffffc) + 8),__src,__n);
        puVar3[(pcapng->block_total_lenght >> 2) - 1] = pcapng->block_total_lenght;
        uVar4 = (int)lVar5 + 0xc;
        if (pcapng->block_total_lenght != uVar4) {
          fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                  ,"light_pcapng_to_memory",0x169,(ulong)pcapng->block_total_lenght,uVar4);
        }
        uVar4 = pcapng->block_total_lenght;
        *size = *size + (ulong)uVar4;
        free(__src);
        pcapng = pcapng->next_block;
        if (pcapng == (_light_pcapng *)0x0) break;
        puVar3 = (uint32_t *)((long)puVar3 + (ulong)(uVar4 & 0xfffffffc));
        __nmemb = __nmemb - uVar4;
      }
      return puVar2;
    }
    light_pcapng_to_memory_cold_1();
  }
  return (uint32_t *)0x0;
}

Assistant:

uint32_t *light_pcapng_to_memory(const light_pcapng pcapng, size_t *size)
{
	if (pcapng == NULL) {
		*size = 0;
		return NULL;
	}

	light_pcapng iterator = pcapng;
	size_t bytes = light_get_size(pcapng);
	uint32_t *block_mem = calloc(bytes, 1);
	uint32_t *block_offset = block_mem;
	DCHECK_NULLP(block_offset, return NULL);

	*size = 0;
	while (iterator != NULL && bytes > 0) {
		size_t body_length = iterator->block_total_lenght - 2 * sizeof(iterator->block_total_lenght) - sizeof(iterator->block_type);
		size_t option_length;
		uint32_t *option_mem = __get_option_size(iterator->options, &option_length);
		body_length -= option_length;

		block_offset[0] = iterator->block_type;
		block_offset[1] = iterator->block_total_lenght;
		memcpy(&block_offset[2], iterator->block_body, body_length);
		memcpy(&block_offset[2 + body_length / 4], option_mem, option_length);
		block_offset[iterator->block_total_lenght / 4 - 1] = iterator->block_total_lenght;

		DCHECK_ASSERT(iterator->block_total_lenght, body_length + option_length + 3 * sizeof(uint32_t), light_stop);
		block_offset += iterator->block_total_lenght / 4;
		bytes -= iterator->block_total_lenght;
		*size += iterator->block_total_lenght;

		free(option_mem);
		iterator = iterator->next_block;
	}

	return block_mem;
}